

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void __thiscall
TPZSkylMatrix<std::complex<double>_>::SetSkyline
          (TPZSkylMatrix<std::complex<double>_> *this,TPZVec<long> *skyline)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (this->fElem).fNElements;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      (this->fElem).fStore[lVar2] = (complex<double> *)0x0;
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  InitializeElem(skyline,&this->fStorage,&this->fElem);
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SetSkyline(const TPZVec<int64_t> &skyline)
{
#ifdef PZDEBUG
	for (int64_t i = 0 ; i < this->Rows() ; i++){
		if (skyline[i] < 0 || skyline[i] > i) DebugStop();
	}
#endif
	fElem.Fill(0);
	InitializeElem(skyline,fStorage,fElem);
}